

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

MempoolAcceptResult * __thiscall
anon_unknown.dwarf_a31d20::MemPoolAccept::AcceptSingleTransaction
          (MemPoolAccept *this,CTransactionRef *ptx,ATMPArgs *args)

{
  long lVar1;
  CFeeRate effective_feerate_00;
  CFeeRate effective_feerate_01;
  CFeeRate effective_feerate_02;
  CFeeRate effective_feerate_03;
  CFeeRate effective_feerate_04;
  initializer_list<transaction_identifier<true>_> __l;
  initializer_list<transaction_identifier<true>_> __l_00;
  string_view source_file;
  string_view logging_function;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  byte bVar6;
  TxValidationResult TVar7;
  Workspace *ws_00;
  Wtxid *pWVar8;
  Workspace *in_RCX;
  ATMPArgs *in_RDX;
  MemPoolAccept *in_RSI;
  MemPoolAccept *in_RDI;
  long in_FS_OFFSET;
  CTransaction *tx;
  CFeeRate effective_feerate;
  vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> single_wtxid;
  NewMempoolTransactionInfo tx_info;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock7;
  Workspace ws;
  uint in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  char *in_stack_fffffffffffff8a0;
  uint height;
  Chainstate *in_stack_fffffffffffff8a8;
  undefined4 uVar9;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_fffffffffffff8b0;
  CTransaction *in_stack_fffffffffffff8b8;
  CTxMemPool *in_stack_fffffffffffff8c0;
  undefined7 in_stack_fffffffffffff8c8;
  undefined1 in_stack_fffffffffffff8cf;
  allocator_type *in_stack_fffffffffffff8d0;
  allocator<char> *in_stack_fffffffffffff8d8;
  undefined4 in_stack_fffffffffffff8e0;
  undefined1 in_stack_fffffffffffff8e4;
  undefined1 in_stack_fffffffffffff8e5;
  undefined1 in_stack_fffffffffffff8e6;
  byte bVar10;
  undefined1 in_stack_fffffffffffff8e7;
  Workspace *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff900;
  uint in_stack_fffffffffffff904;
  uint64_t in_stack_fffffffffffff908;
  int source_line;
  Workspace *in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff918;
  undefined1 in_stack_fffffffffffff91c;
  undefined1 in_stack_fffffffffffff91d;
  undefined1 in_stack_fffffffffffff91e;
  undefined1 in_stack_fffffffffffff91f;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  ConstevalFormatString<3U> in_stack_fffffffffffff948;
  undefined7 in_stack_fffffffffffff950;
  undefined1 uVar11;
  undefined4 in_stack_fffffffffffff958;
  undefined4 in_stack_fffffffffffff95c;
  undefined4 uVar12;
  undefined1 *puVar13;
  MemPoolAccept *this_00;
  MemPoolAccept *this_01;
  list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  local_5f8 [2];
  Level in_stack_fffffffffffffa40;
  unsigned_long *in_stack_fffffffffffffa50;
  long *in_stack_fffffffffffffa58;
  undefined7 in_stack_fffffffffffffa60;
  undefined1 in_stack_fffffffffffffa67;
  allocator<char> local_57a;
  allocator<char> local_579 [24];
  undefined1 local_561 [89];
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_268;
  undefined8 uStack_260;
  _Base_ptr local_258;
  _Base_ptr p_Stack_250;
  Workspace *in_stack_fffffffffffffe18;
  ATMPArgs *in_stack_fffffffffffffe20;
  MemPoolAccept *in_stack_fffffffffffffe28;
  long local_198;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  this_01 = in_RSI;
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffff8a8,in_stack_fffffffffffff8a0,in_stack_fffffffffffff89c,
             (AnnotatedMixin<std::recursive_mutex> *)0x7ca622);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff8d8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff8d0,
             (char *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
             (char *)in_stack_fffffffffffff8c0,(int)((ulong)in_stack_fffffffffffff8b8 >> 0x20),
             SUB81((ulong)in_stack_fffffffffffff8b8 >> 0x18,0));
  Workspace::Workspace
            (in_stack_fffffffffffff8e8,
             (CTransactionRef *)
             CONCAT17(in_stack_fffffffffffff8e7,
                      CONCAT16(in_stack_fffffffffffff8e6,
                               CONCAT15(in_stack_fffffffffffff8e5,
                                        CONCAT14(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0
                                                )))));
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  ws_00 = (Workspace *)
          CTransaction::GetWitnessHash
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  local_268 = *(undefined8 *)&(ws_00->m_conflicts)._M_t._M_impl;
  uStack_260 = *(undefined8 *)&(ws_00->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_258 = (ws_00->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Stack_250 = (ws_00->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  puVar13 = local_561;
  std::allocator<transaction_identifier<true>_>::allocator
            ((allocator<transaction_identifier<true>_> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  __l._M_array._4_1_ = in_stack_fffffffffffff8e4;
  __l._M_array._0_4_ = in_stack_fffffffffffff8e0;
  __l._M_array._5_1_ = in_stack_fffffffffffff8e5;
  __l._M_array._6_1_ = in_stack_fffffffffffff8e6;
  __l._M_array._7_1_ = in_stack_fffffffffffff8e7;
  __l._M_len = (size_type)in_stack_fffffffffffff8e8;
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffff8d8,__l,in_stack_fffffffffffff8d0);
  std::allocator<transaction_identifier<true>_>::~allocator
            ((allocator<transaction_identifier<true>_> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  bVar2 = PreChecks(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
  uVar12 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff95c);
  if (bVar2) {
    bVar2 = std::optional::operator_cast_to_bool
                      ((optional<CFeeRate> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    uVar11 = false;
    if (bVar2) {
      CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff8b8,(CAmount *)in_stack_fffffffffffff8b0,
                         (uint32_t)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
      in_stack_fffffffffffff948.fmt =
           (char *)std::optional<CFeeRate>::value((optional<CFeeRate> *)in_stack_fffffffffffff8a8);
      in_stack_fffffffffffff947 =
           operator>((CFeeRate *)in_stack_fffffffffffff8a8,(CFeeRate *)in_stack_fffffffffffff8a0);
      uVar11 = in_stack_fffffffffffff947;
    }
    if ((bool)uVar11 == false) {
      if ((((in_RSI->m_subpackage).m_rbf & 1U) == 0) ||
         (bVar2 = ReplacementChecks((MemPoolAccept *)
                                    CONCAT17(in_stack_fffffffffffff91f,
                                             CONCAT16(in_stack_fffffffffffff91e,
                                                      CONCAT15(in_stack_fffffffffffff91d,
                                                               CONCAT14(in_stack_fffffffffffff91c,
                                                                        in_stack_fffffffffffff918)))
                                            ),in_stack_fffffffffffff910), bVar2)) {
        uVar3 = PolicyScriptChecks(this_00,(ATMPArgs *)in_RDI,ws_00);
        if ((bool)uVar3) {
          uVar4 = ConsensusScriptChecks
                            ((MemPoolAccept *)CONCAT17(uVar11,in_stack_fffffffffffff950),
                             (ATMPArgs *)in_stack_fffffffffffff948.fmt,
                             (Workspace *)
                             CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
          if ((bool)uVar4) {
            CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff8b8,
                               (CAmount *)in_stack_fffffffffffff8b0,
                               (uint32_t)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
            if (((ulong)(in_RCX->m_conflicts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right
                & 1) == 0) {
              uVar5 = Finalize(this_01,in_RDX,in_RCX);
              if ((bool)uVar5) {
                if ((in_RSI->m_pool->m_opts).signals != (ValidationSignals *)0x0) {
                  std::
                  __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator*((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)in_stack_fffffffffffff8a8);
                  height = (uint)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
                  std::unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_>::
                  operator->((unique_ptr<CTxMemPoolEntry,_std::default_delete<CTxMemPoolEntry>_> *)
                             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                  in_stack_fffffffffffff904 =
                       CTxMemPoolEntry::GetHeight
                                 ((CTxMemPoolEntry *)
                                  CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                  bVar10 = *(byte *)((long)&(in_RCX->m_conflicts)._M_t._M_impl.super__Rb_tree_header
                                            ._M_header._M_right + 3);
                  bVar6 = IsCurrentForFeeEstimation(in_stack_fffffffffffff8a8);
                  uVar9 = (undefined4)((ulong)in_stack_fffffffffffff8a8 >> 0x20);
                  bVar2 = CTxMemPool::HasNoInputsOf
                                    (in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
                  in_stack_fffffffffffff8a8 = (Chainstate *)CONCAT44(uVar9,(uint)bVar2);
                  in_stack_fffffffffffff8a0 =
                       (char *)(CONCAT44(height,(uint)bVar6) & 0xffffffff00000001);
                  in_stack_fffffffffffff898 = bVar10 & 1;
                  NewMempoolTransactionInfo::NewMempoolTransactionInfo
                            ((NewMempoolTransactionInfo *)in_stack_fffffffffffff8c0,
                             (CTransactionRef *)in_stack_fffffffffffff8b8,
                             (CAmount *)in_stack_fffffffffffff8b0,(int64_t)in_stack_fffffffffffff8a8
                             ,height,false,false,false,(bool)(bVar6 & 1));
                  CTxMemPool::GetAndIncrementSequence
                            ((CTxMemPool *)
                             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                  ValidationSignals::TransactionAddedToMempool
                            ((ValidationSignals *)
                             CONCAT17(uVar3,CONCAT16(uVar4,CONCAT15(uVar5,CONCAT14(
                                                  in_stack_fffffffffffff91c,
                                                  in_stack_fffffffffffff918)))),
                             (NewMempoolTransactionInfo *)in_stack_fffffffffffff910,
                             in_stack_fffffffffffff908);
                  NewMempoolTransactionInfo::~NewMempoolTransactionInfo
                            ((NewMempoolTransactionInfo *)
                             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                }
                source_line = (int)(in_stack_fffffffffffff908 >> 0x20);
                bVar2 = std::__cxx11::
                        list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                        ::empty((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                if ((!bVar2) &&
                   (in_stack_fffffffffffff8cf =
                         ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffff89c,
                                                      in_stack_fffffffffffff898),Trace),
                   (bool)in_stack_fffffffffffff8cf)) {
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0);
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            ((basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0);
                  local_5f8[0].
                  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev =
                       (_List_node_base *)
                       std::__cxx11::
                       list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                       ::size((list<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                  local_5f8[0].
                  super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next =
                       (_List_node_base *)(local_198 - (in_RSI->m_subpackage).m_conflicting_fees);
                  in_stack_fffffffffffff8b0 = local_5f8;
                  in_stack_fffffffffffff8a8 =
                       (Chainstate *)
                       ((long)&local_5f8[0].
                               super__List_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                               ._M_impl._M_node.super__List_node_base + 8);
                  in_stack_fffffffffffff8a0 =
                       "replaced %u mempool transactions with 1 new transaction for %s additional fees, %d delta bytes\n"
                  ;
                  in_stack_fffffffffffff898 = 1;
                  logging_function._M_str = (char *)ws_00;
                  logging_function._M_len = (size_t)puVar13;
                  source_file._M_len._7_1_ = uVar11;
                  source_file._M_len._0_7_ = in_stack_fffffffffffff950;
                  source_file._M_str._0_4_ = in_stack_fffffffffffff958;
                  source_file._M_str._4_4_ = uVar12;
                  LogPrintFormatInternal<unsigned_long,long,long>
                            (logging_function,source_file,source_line,
                             CONCAT44(in_stack_fffffffffffff904,in_stack_fffffffffffff900),
                             in_stack_fffffffffffffa40,in_stack_fffffffffffff948,
                             in_stack_fffffffffffffa50,in_stack_fffffffffffffa58,
                             (long *)CONCAT17(in_stack_fffffffffffffa67,in_stack_fffffffffffffa60));
                }
                effective_feerate_01.nSatoshisPerK._7_1_ = in_stack_fffffffffffff8cf;
                effective_feerate_01.nSatoshisPerK._0_7_ = in_stack_fffffffffffff8c8;
                MempoolAcceptResult::Success
                          (in_stack_fffffffffffff8b0,(int64_t)in_stack_fffffffffffff8a8,
                           (CAmount)in_stack_fffffffffffff8a0,effective_feerate_01,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
              }
              else {
                ValidationState<TxValidationResult>::GetResult
                          ((ValidationState<TxValidationResult> *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                inline_assertion_check<false,bool>
                          ((bool *)in_stack_fffffffffffff8b8,(char *)in_stack_fffffffffffff8b0,
                           (int)((ulong)in_stack_fffffffffffff8a8 >> 0x20),in_stack_fffffffffffff8a0
                           ,(char *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                TxValidationState::TxValidationState
                          ((TxValidationState *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                           (TxValidationState *)0x7caf69);
                CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff8b8,
                                   (CAmount *)in_stack_fffffffffffff8b0,
                                   (uint32_t)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
                std::
                __shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                pWVar8 = CTransaction::GetWitnessHash
                                   ((CTransaction *)
                                    CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                local_508 = *(undefined8 *)(pWVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems
                ;
                uStack_500 = *(undefined8 *)
                              ((pWVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 8);
                local_4f8 = *(undefined8 *)
                             ((pWVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x10);
                uStack_4f0 = *(undefined8 *)
                              ((pWVar8->m_wrapped).super_base_blob<256U>.m_data._M_elems + 0x18);
                std::allocator<transaction_identifier<true>_>::allocator
                          ((allocator<transaction_identifier<true>_> *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                __l_00._M_array._4_1_ = in_stack_fffffffffffff8e4;
                __l_00._M_array._0_4_ = in_stack_fffffffffffff8e0;
                __l_00._M_array._5_1_ = in_stack_fffffffffffff8e5;
                __l_00._M_array._6_1_ = in_stack_fffffffffffff8e6;
                __l_00._M_array._7_1_ = in_stack_fffffffffffff8e7;
                __l_00._M_len = (size_type)in_stack_fffffffffffff8e8;
                std::
                vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ::vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          *)in_stack_fffffffffffff8d8,__l_00,in_stack_fffffffffffff8d0);
                effective_feerate_04.nSatoshisPerK._4_1_ = in_stack_fffffffffffff8e4;
                effective_feerate_04.nSatoshisPerK._0_4_ = in_stack_fffffffffffff8e0;
                effective_feerate_04.nSatoshisPerK._5_1_ = in_stack_fffffffffffff8e5;
                effective_feerate_04.nSatoshisPerK._6_1_ = in_stack_fffffffffffff8e6;
                effective_feerate_04.nSatoshisPerK._7_1_ = in_stack_fffffffffffff8e7;
                MempoolAcceptResult::FeeFailure
                          ((TxValidationState *)
                           CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                           effective_feerate_04,
                           (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                            *)in_stack_fffffffffffff8c0);
                std::
                vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                ::~vector((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                           *)in_stack_fffffffffffff8a8);
                std::allocator<transaction_identifier<true>_>::~allocator
                          ((allocator<transaction_identifier<true>_> *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
                TxValidationState::~TxValidationState
                          ((TxValidationState *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
              }
            }
            else {
              effective_feerate_00.nSatoshisPerK._7_1_ = in_stack_fffffffffffff8cf;
              effective_feerate_00.nSatoshisPerK._0_7_ = in_stack_fffffffffffff8c8;
              MempoolAcceptResult::Success
                        (in_stack_fffffffffffff8b0,(int64_t)in_stack_fffffffffffff8a8,
                         (CAmount)in_stack_fffffffffffff8a0,effective_feerate_00,
                         (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                          *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
            }
          }
          else {
            TxValidationState::TxValidationState
                      ((TxValidationState *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                       (TxValidationState *)0x7cade2);
            MempoolAcceptResult::Failure
                      ((TxValidationState *)
                       CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
            TxValidationState::~TxValidationState
                      ((TxValidationState *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
          }
        }
        else {
          TxValidationState::TxValidationState
                    ((TxValidationState *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (TxValidationState *)0x7cad3a);
          MempoolAcceptResult::Failure
                    ((TxValidationState *)
                     CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          TxValidationState::~TxValidationState
                    ((TxValidationState *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        }
      }
      else {
        TVar7 = ValidationState<TxValidationResult>::GetResult
                          ((ValidationState<TxValidationResult> *)
                           CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        if (TVar7 == TX_RECONSIDERABLE) {
          TxValidationState::TxValidationState
                    ((TxValidationState *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (TxValidationState *)0x7cabef);
          CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff8b8,
                             (CAmount *)in_stack_fffffffffffff8b0,
                             (uint32_t)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
          effective_feerate_03.nSatoshisPerK._4_1_ = in_stack_fffffffffffff8e4;
          effective_feerate_03.nSatoshisPerK._0_4_ = in_stack_fffffffffffff8e0;
          effective_feerate_03.nSatoshisPerK._5_1_ = in_stack_fffffffffffff8e5;
          effective_feerate_03.nSatoshisPerK._6_1_ = in_stack_fffffffffffff8e6;
          effective_feerate_03.nSatoshisPerK._7_1_ = in_stack_fffffffffffff8e7;
          MempoolAcceptResult::FeeFailure
                    ((TxValidationState *)
                     CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                     effective_feerate_03,
                     (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                      *)in_stack_fffffffffffff8c0);
          TxValidationState::~TxValidationState
                    ((TxValidationState *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        }
        else {
          TxValidationState::TxValidationState
                    ((TxValidationState *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                     (TxValidationState *)0x7cac92);
          MempoolAcceptResult::Failure
                    ((TxValidationState *)
                     CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8));
          TxValidationState::~TxValidationState
                    ((TxValidationState *)
                     CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      TVar7 = (TxValidationResult)((ulong)in_stack_fffffffffffff8b0 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8e8,
                 (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                  CONCAT16(in_stack_fffffffffffff8e6,
                                           CONCAT15(in_stack_fffffffffffff8e5,
                                                    CONCAT14(in_stack_fffffffffffff8e4,
                                                             in_stack_fffffffffffff8e0)))),
                 in_stack_fffffffffffff8d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff8e8,
                 (char *)CONCAT17(in_stack_fffffffffffff8e7,
                                  CONCAT16(in_stack_fffffffffffff8e6,
                                           CONCAT15(in_stack_fffffffffffff8e5,
                                                    CONCAT14(in_stack_fffffffffffff8e4,
                                                             in_stack_fffffffffffff8e0)))),
                 in_stack_fffffffffffff8d8);
      ValidationState<TxValidationResult>::Invalid
                ((ValidationState<TxValidationResult> *)in_stack_fffffffffffff8b8,TVar7,
                 (string *)in_stack_fffffffffffff8a8,(string *)in_stack_fffffffffffff8a0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      std::allocator<char>::~allocator(&local_57a);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
      std::allocator<char>::~allocator(local_579);
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                 (TxValidationState *)0x7caa8b);
      MempoolAcceptResult::Failure
                ((TxValidationState *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8))
      ;
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
      ;
    }
  }
  else {
    TVar7 = ValidationState<TxValidationResult>::GetResult
                      ((ValidationState<TxValidationResult> *)
                       CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
    if (TVar7 == TX_RECONSIDERABLE) {
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                 (TxValidationState *)0x7ca78a);
      CFeeRate::CFeeRate((CFeeRate *)in_stack_fffffffffffff8b8,(CAmount *)in_stack_fffffffffffff8b0,
                         (uint32_t)((ulong)in_stack_fffffffffffff8a8 >> 0x20));
      effective_feerate_02.nSatoshisPerK._4_1_ = in_stack_fffffffffffff8e4;
      effective_feerate_02.nSatoshisPerK._0_4_ = in_stack_fffffffffffff8e0;
      effective_feerate_02.nSatoshisPerK._5_1_ = in_stack_fffffffffffff8e5;
      effective_feerate_02.nSatoshisPerK._6_1_ = in_stack_fffffffffffff8e6;
      effective_feerate_02.nSatoshisPerK._7_1_ = in_stack_fffffffffffff8e7;
      MempoolAcceptResult::FeeFailure
                ((TxValidationState *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8),
                 effective_feerate_02,
                 (vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>
                  *)in_stack_fffffffffffff8c0);
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
      ;
    }
    else {
      TxValidationState::TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                 (TxValidationState *)0x7ca8ae);
      MempoolAcceptResult::Failure
                ((TxValidationState *)CONCAT17(in_stack_fffffffffffff8cf,in_stack_fffffffffffff8c8))
      ;
      TxValidationState::~TxValidationState
                ((TxValidationState *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898))
      ;
    }
  }
  std::vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_>::~vector
            ((vector<transaction_identifier<true>,_std::allocator<transaction_identifier<true>_>_> *
             )in_stack_fffffffffffff8a8);
  Workspace::~Workspace((Workspace *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (MempoolAcceptResult *)this_00;
}

Assistant:

MempoolAcceptResult MemPoolAccept::AcceptSingleTransaction(const CTransactionRef& ptx, ATMPArgs& args)
{
    AssertLockHeld(cs_main);
    LOCK(m_pool.cs); // mempool "read lock" (held through m_pool.m_opts.signals->TransactionAddedToMempool())

    Workspace ws(ptx);
    const std::vector<Wtxid> single_wtxid{ws.m_ptx->GetWitnessHash()};

    if (!PreChecks(args, ws)) {
        if (ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // Failed for fee reasons. Provide the effective feerate and which tx was included.
            return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), single_wtxid);
        }
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    // Individual modified feerate exceeded caller-defined max; abort
    if (args.m_client_maxfeerate && CFeeRate(ws.m_modified_fees, ws.m_vsize) > args.m_client_maxfeerate.value()) {
        ws.m_state.Invalid(TxValidationResult::TX_MEMPOOL_POLICY, "max feerate exceeded", "");
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    if (m_subpackage.m_rbf && !ReplacementChecks(ws)) {
        if (ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE) {
            // Failed for incentives-based fee reasons. Provide the effective feerate and which tx was included.
            return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), single_wtxid);
        }
        return MempoolAcceptResult::Failure(ws.m_state);
    }

    // Perform the inexpensive checks first and avoid hashing and signature verification unless
    // those checks pass, to mitigate CPU exhaustion denial-of-service attacks.
    if (!PolicyScriptChecks(args, ws)) return MempoolAcceptResult::Failure(ws.m_state);

    if (!ConsensusScriptChecks(args, ws)) return MempoolAcceptResult::Failure(ws.m_state);

    const CFeeRate effective_feerate{ws.m_modified_fees, static_cast<uint32_t>(ws.m_vsize)};
    // Tx was accepted, but not added
    if (args.m_test_accept) {
        return MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize,
                                            ws.m_base_fees, effective_feerate, single_wtxid);
    }

    if (!Finalize(args, ws)) {
        // The only possible failure reason is fee-related (mempool full).
        // Failed for fee reasons. Provide the effective feerate and which txns were included.
        Assume(ws.m_state.GetResult() == TxValidationResult::TX_RECONSIDERABLE);
        return MempoolAcceptResult::FeeFailure(ws.m_state, CFeeRate(ws.m_modified_fees, ws.m_vsize), {ws.m_ptx->GetWitnessHash()});
    }

    if (m_pool.m_opts.signals) {
        const CTransaction& tx = *ws.m_ptx;
        const auto tx_info = NewMempoolTransactionInfo(ws.m_ptx, ws.m_base_fees,
                                                       ws.m_vsize, ws.m_entry->GetHeight(),
                                                       args.m_bypass_limits, args.m_package_submission,
                                                       IsCurrentForFeeEstimation(m_active_chainstate),
                                                       m_pool.HasNoInputsOf(tx));
        m_pool.m_opts.signals->TransactionAddedToMempool(tx_info, m_pool.GetAndIncrementSequence());
    }

    if (!m_subpackage.m_replaced_transactions.empty()) {
        LogDebug(BCLog::MEMPOOL, "replaced %u mempool transactions with 1 new transaction for %s additional fees, %d delta bytes\n",
                 m_subpackage.m_replaced_transactions.size(),
                 ws.m_modified_fees - m_subpackage.m_conflicting_fees,
                 ws.m_vsize - static_cast<int>(m_subpackage.m_conflicting_size));
    }

    return MempoolAcceptResult::Success(std::move(m_subpackage.m_replaced_transactions), ws.m_vsize, ws.m_base_fees,
                                        effective_feerate, single_wtxid);
}